

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  size_t *psVar1;
  BYTE *src;
  void *src_00;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ZSTD_freeFunction p_Var8;
  ZSTD_allocFunction p_Var9;
  uint uVar10;
  ZSTD_nextInputType_e ZVar11;
  ZSTD_DDict *pZVar12;
  char *pcVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  void *src_01;
  void *pvVar17;
  ulong uVar18;
  size_t __n;
  ZSTD_dStage ZVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ZSTD_frameSizeInfo ZVar25;
  void *local_b0;
  
  uVar14 = input->pos;
  uVar4 = input->size;
  if (uVar4 < uVar14) {
    return 0xffffffffffffffb8;
  }
  uVar5 = output->pos;
  uVar6 = output->size;
  if (uVar6 < uVar5) {
    return 0xffffffffffffffba;
  }
  src_00 = (void *)(uVar14 + (long)input->src);
  pvVar20 = (void *)((long)input->src + uVar4);
  pvVar7 = output->dst;
  pvVar2 = (void *)((long)pvVar7 + uVar5);
  psVar1 = &zds->outStart;
  src = zds->headerBuffer;
  local_b0 = pvVar2;
  src_01 = src_00;
LAB_0016adbb:
  uVar18 = (long)pvVar7 + (uVar6 - (long)local_b0);
LAB_0016adc8:
  switch(zds->streamStage) {
  case zdss_init:
    zds->streamStage = zdss_loadHeader;
    zds->inPos = 0;
    zds->legacyVersion = 0;
    zds->hostageByte = 0;
    zds->lhSize = 0;
    *psVar1 = 0;
    zds->outEnd = 0;
    sVar15 = 0;
    break;
  case zdss_loadHeader:
    sVar15 = zds->lhSize;
    break;
  case zdss_read:
    goto switchD_0016ade6_caseD_2;
  case zdss_load:
    sVar15 = zds->expected;
    ZVar19 = zds->stage;
    __n = (long)pvVar20 - (long)src_01;
    uVar10 = ZVar19 - ZSTDds_decompressBlock;
    goto LAB_0016b110;
  case zdss_flush:
    goto switchD_0016ade6_caseD_4;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6080,
                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)")
    ;
  }
  sVar15 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar15,zds->format);
  if (0xffffffffffffff88 < sVar15) {
    return sVar15;
  }
  if (sVar15 == 0) {
    uVar21 = (zds->fParams).frameContentSize;
    if (((uVar21 != 0) && ((zds->fParams).windowSize != 0)) && (uVar21 <= uVar18)) {
      ZVar25 = ZSTD_findFrameSizeInfo(src_00,uVar4 - uVar14);
      uVar21 = ZVar25.compressedSize;
      if (uVar4 - uVar14 < uVar21) goto LAB_0016aee8;
      pZVar12 = ZSTD_getDDict(zds);
      sVar15 = ZSTD_decompressMultiFrame(zds,local_b0,uVar18,src_00,uVar21,(void *)0x0,0,pZVar12);
      if (0xffffffffffffff88 < sVar15) {
        return sVar15;
      }
      src_01 = (void *)(uVar21 + (long)src_00);
      local_b0 = (void *)((long)local_b0 + sVar15);
      zds->expected = 0;
LAB_0016b460:
      zds->streamStage = zdss_init;
      pvVar17 = src_01;
      goto LAB_0016b46a;
    }
LAB_0016aee8:
    pZVar12 = ZSTD_getDDict(zds);
    ZSTD_decompressBegin_usingDDict(zds,pZVar12);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      uVar21 = (ulong)*(uint *)(zds->headerBuffer + 4);
      ZVar19 = ZSTDds_skipFrame;
    }
    else {
      sVar15 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
      if (0xffffffffffffff88 < sVar15) {
        return sVar15;
      }
      ZVar19 = ZSTDds_decodeBlockHeader;
      uVar21 = 3;
    }
    zds->expected = uVar21;
    zds->stage = ZVar19;
    uVar21 = (zds->fParams).windowSize;
    if (uVar21 < 0x401) {
      uVar21 = 0x400;
    }
    (zds->fParams).windowSize = uVar21;
    if (zds->maxWindowSize < uVar21) {
      return 0xfffffffffffffff0;
    }
    uVar10 = (zds->fParams).blockSizeMax;
    if (uVar10 < 5) {
      uVar10 = 4;
    }
    uVar23 = (ulong)uVar10;
    uVar22 = (zds->fParams).frameContentSize;
    uVar16 = 0x20000;
    if (uVar21 < 0x20000) {
      uVar16 = uVar21;
    }
    uVar21 = uVar21 + uVar16 + 0x40;
    if (uVar21 < uVar22) {
      uVar22 = uVar21;
    }
    uVar21 = uVar22 + uVar23;
    if (zds->outBuffSize + zds->inBuffSize < uVar21 * 3) {
      uVar16 = 0;
    }
    else {
      uVar16 = zds->oversizedDuration + 1;
    }
    zds->oversizedDuration = uVar16;
    if ((zds->inBuffSize < uVar23) || (zds->outBuffSize < uVar22 || 0x7f < uVar16)) {
      uVar16 = zds->staticSize;
      if (uVar16 == 0) {
        pcVar13 = zds->inBuff;
        if (pcVar13 != (char *)0x0) {
          p_Var8 = (zds->customMem).customFree;
          if (p_Var8 == (ZSTD_freeFunction)0x0) {
            free(pcVar13);
          }
          else {
            (*p_Var8)((zds->customMem).opaque,pcVar13);
          }
        }
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        p_Var9 = (zds->customMem).customAlloc;
        if (p_Var9 == (ZSTD_allocFunction)0x0) {
          pcVar13 = (char *)malloc(uVar21);
        }
        else {
          pcVar13 = (char *)(*p_Var9)((zds->customMem).opaque,uVar21);
        }
        zds->inBuff = pcVar13;
        if (pcVar13 == (char *)0x0) {
          return 0xffffffffffffffc0;
        }
      }
      else {
        if (uVar16 < 0x27218) {
          __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6021,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        if (uVar16 - 0x27218 < uVar21) {
          return 0xffffffffffffffc0;
        }
        pcVar13 = zds->inBuff;
      }
      zds->inBuffSize = uVar23;
      zds->outBuff = pcVar13 + uVar23;
      zds->outBuffSize = uVar22;
    }
    zds->streamStage = zdss_read;
switchD_0016ade6_caseD_2:
    __n = (long)pvVar20 - (long)src_01;
    ZVar19 = zds->stage;
    uVar10 = ZVar19 - ZSTDds_decompressBlock;
    if ((uVar10 < 2) && (zds->bType == bt_raw)) {
      uVar21 = __n + (__n == 0);
      sVar15 = zds->expected;
      if (sVar15 <= uVar21) {
        uVar21 = sVar15;
      }
    }
    else {
      sVar15 = zds->expected;
      uVar21 = sVar15;
    }
    if (uVar21 == 0) goto LAB_0016b460;
    if (__n < uVar21) {
      pvVar17 = pvVar20;
      if (src_01 == pvVar20) goto LAB_0016b46a;
      zds->streamStage = zdss_load;
LAB_0016b110:
      sVar24 = zds->inPos;
      uVar21 = sVar15 - sVar24;
      if (uVar10 < 2) {
        if ((zds->bType == bt_raw) && (__n + (__n == 0) < sVar15)) {
          __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6052,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
LAB_0016b14f:
        if (zds->inBuffSize - sVar24 < uVar21) {
          return 0xffffffffffffffec;
        }
        if (uVar21 < __n) {
          __n = uVar21;
        }
        if (__n == 0) {
          __n = 0;
        }
        else {
          memcpy(zds->inBuff + sVar24,src_01,__n);
          sVar24 = zds->inPos;
        }
      }
      else {
        if (ZVar19 != ZSTDds_skipFrame) goto LAB_0016b14f;
        if (uVar21 < __n) {
          __n = uVar21;
        }
      }
      src_01 = (void *)((long)src_01 + __n);
      zds->inPos = sVar24 + __n;
      pvVar17 = src_01;
      if (__n < uVar21) goto LAB_0016b46a;
      sVar15 = ZSTD_decompressContinue
                         (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                          zds->inBuff,sVar15);
      if (0xffffffffffffff88 < sVar15) {
        return sVar15;
      }
      zds->inPos = 0;
      if ((ZVar19 == ZSTDds_skipFrame) || (sVar15 != 0)) {
        sVar24 = zds->outStart;
        sVar15 = sVar15 + sVar24;
        zds->outEnd = sVar15;
        zds->streamStage = zdss_flush;
        goto LAB_0016b2d4;
      }
      zds->streamStage = zdss_read;
    }
    else {
      if (ZVar19 == ZSTDds_skipFrame) {
        sVar15 = 0;
      }
      else {
        sVar15 = zds->outBuffSize - zds->outStart;
      }
      sVar15 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar15,src_01,uVar21);
      if (0xffffffffffffff88 < sVar15) {
        return sVar15;
      }
      src_01 = (void *)((long)src_01 + uVar21);
      if ((ZVar19 == ZSTDds_skipFrame) || (sVar15 != 0)) {
        zds->outEnd = zds->outStart + sVar15;
        zds->streamStage = zdss_flush;
      }
    }
  }
  else {
    uVar21 = (long)pvVar20 - (long)src_01;
    if (pvVar20 < src_01) {
      __assert_fail("iend >= ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5fdc,
                    "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                   );
    }
    sVar24 = zds->lhSize;
    uVar22 = sVar15 - sVar24;
    if (uVar21 < uVar22) {
      if (pvVar20 != src_01) {
        memcpy(src + sVar24,src_01,uVar21);
        sVar24 = uVar21 + zds->lhSize;
        zds->lhSize = sVar24;
      }
      input->pos = input->size;
      uVar14 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
      if (sVar15 < uVar14) {
        sVar15 = uVar14;
      }
      return (sVar15 - sVar24) + 3;
    }
    if (src_01 == (void *)0x0) {
      __assert_fail("ip != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5fe5,
                    "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                   );
    }
    memcpy(src + sVar24,src_01,uVar22);
    zds->lhSize = sVar15;
    src_01 = (void *)((long)src_01 + uVar22);
  }
  goto LAB_0016adc8;
switchD_0016ade6_caseD_4:
  sVar24 = zds->outStart;
  sVar15 = zds->outEnd;
LAB_0016b2d4:
  uVar22 = sVar15 - sVar24;
  uVar21 = uVar22;
  if (uVar18 < uVar22) {
    uVar21 = uVar18;
  }
  if (uVar21 != 0) {
    memcpy(local_b0,zds->outBuff + sVar24,uVar21);
    sVar24 = zds->outStart;
  }
  local_b0 = (void *)((long)local_b0 + uVar21);
  *psVar1 = sVar24 + uVar21;
  pvVar17 = src_01;
  if (uVar18 < uVar22) goto LAB_0016b46a;
  zds->streamStage = zdss_read;
  if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
     (zds->outBuffSize < sVar24 + uVar21 + (ulong)(zds->fParams).blockSizeMax)) {
    *psVar1 = 0;
    zds->outEnd = 0;
  }
  goto LAB_0016adbb;
LAB_0016b46a:
  uVar18 = (long)pvVar17 - (long)input->src;
  input->pos = uVar18;
  output->pos = (long)local_b0 - (long)output->dst;
  if ((pvVar17 == src_00) && (local_b0 == pvVar2)) {
    iVar3 = zds->noForwardProgress;
    zds->noForwardProgress = iVar3 + 1;
    if (0xe < iVar3) {
      if (uVar5 == uVar6) {
        return 0xffffffffffffffba;
      }
      if (uVar4 != uVar14) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x608c,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      return 0xffffffffffffffb8;
    }
  }
  else {
    zds->noForwardProgress = 0;
  }
  sVar15 = zds->expected;
  if (sVar15 != 0) {
    ZVar11 = ZSTD_nextInputType(zds);
    uVar14 = (ulong)(ZVar11 == ZSTDnit_block) * 3 + sVar15;
    if (uVar14 < zds->inPos) {
      __assert_fail("zds->inPos <= nextSrcSizeHint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x60a5,
                    "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                   );
    }
    return uVar14 - zds->inPos;
  }
  if (zds->outEnd == zds->outStart) {
    if (zds->hostageByte != 0) {
      if (input->size <= uVar18) {
        zds->streamStage = zdss_read;
        goto LAB_0016b5a0;
      }
      input->pos = uVar18 + 1;
    }
    sVar15 = 0;
  }
  else {
    if (zds->hostageByte == 0) {
      input->pos = uVar18 - 1;
      zds->hostageByte = 1;
    }
LAB_0016b5a0:
    sVar15 = 1;
  }
  return sVar15;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation);
                        } else {
                            ZSTD_free(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}